

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O2

void __thiscall
spdlog::populators::logger_name_populator::~logger_name_populator(logger_name_populator *this)

{
  pattern_populator::~pattern_populator(&this->super_pattern_populator);
  operator_delete(this);
  return;
}

Assistant:

class SPDLOG_API logger_name_populator : public pattern_populator
{
public:
    logger_name_populator();

    virtual void populate(const details::log_msg &msg, nlohmann::json &dest) override;

    virtual std::unique_ptr<populator> clone() const override;
}